

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pstring.cpp
# Opt level: O2

int main(void)

{
  pstring pVar1;
  bool bVar2;
  int iVar3;
  char *__old_val;
  char *pcVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __x_01;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __y_01;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __y_02;
  basic_pstring<wchar_t> local_68;
  pstring ps;
  pstring ps2;
  undefined4 local_34;
  
  boost::detail::test_results();
  ps2.data_._0_4_ = 7;
  ps.data_._0_4_ = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x18,"int main()",&ps2,&ps);
  boost::detail::test_results();
  ps.data_._0_1_ = 7;
  ps2.data_._0_4_ = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x1e,"int main()",&ps,&ps2);
  boost::detail::test_results();
  ps2.data_._0_4_ = 4;
  ps.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x25,"int main()",&ps2,&ps);
  boost::detail::test_results();
  ps.data_._0_1_ = 4;
  ps2.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x2c,"int main()",&ps,&ps2);
  xll::basic_pstring<char>::basic_pstring(&ps,"Test",'\x04');
  boost::detail::test_results();
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2,"Test",4);
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x33,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  std::__cxx11::string::~string((string *)&ps2);
  xll::basic_pstring<char>::destroy(&ps);
  xll::basic_pstring<wchar_t>::basic_pstring((basic_pstring<wchar_t> *)&ps,L"Test",4);
  boost::detail::test_results();
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2,
               L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring
            (&local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  bVar2 = xll::operator==((basic_pstring<wchar_t> *)&ps,&local_68);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3a,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy(&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  xll::basic_pstring<wchar_t>::destroy((basic_pstring<wchar_t> *)&ps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ps2,"Test",(allocator<char> *)&local_68);
  xll::basic_pstring<char>::basic_pstring
            (&ps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  std::__cxx11::string::~string((string *)&ps2);
  if (ps.data_ == (char *)0x0) {
    ps2.data_ = (char *)0x0;
  }
  else {
    ps2.data_ = (char *)(long)*ps.data_;
  }
  local_68.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3f,"int main()",&ps2,(allocator<char> *)&local_68);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2,"Test",4);
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x40,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  std::__cxx11::string::~string((string *)&ps2);
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2,
               L"Test",4);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            ((basic_pstring<char> *)&local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x41,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    sVar6 = 0;
    pcVar4 = (char *)0x0;
  }
  else {
    sVar6 = (size_t)*ps.data_;
    pcVar4 = ps.data_ + 1;
    if (sVar6 == 0) {
      pcVar4 = (char *)0x0;
    }
  }
  __x._M_str = pcVar4;
  __x._M_len = sVar6;
  __y._M_str = "Test";
  __y._M_len = 4;
  bVar2 = std::operator==(__x,__y);
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x42,"int main()",bVar2);
  xll::basic_pstring<char>::destroy(&ps);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&ps2,L"Test",(allocator<wchar_t> *)&local_68);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            (&ps,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2)
  ;
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    ps2.data_ = (char *)0x0;
  }
  else {
    ps2.data_ = (char *)(long)*ps.data_;
  }
  local_68.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x47,"int main()",&ps2,(allocator<wchar_t> *)&local_68);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2,"Test",4);
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x48,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  std::__cxx11::string::~string((string *)&ps2);
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2,
               L"Test",4);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            ((basic_pstring<char> *)&local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x49,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    sVar6 = 0;
    pcVar4 = (char *)0x0;
  }
  else {
    sVar6 = (size_t)*ps.data_;
    pcVar4 = ps.data_ + 1;
    if (sVar6 == 0) {
      pcVar4 = (char *)0x0;
    }
  }
  __x_00._M_str = pcVar4;
  __x_00._M_len = sVar6;
  __y_00._M_str = "Test";
  __y_00._M_len = 4;
  bVar2 = std::operator==(__x_00,__y_00);
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4a,"int main()",bVar2);
  xll::basic_pstring<char>::destroy(&ps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ps2,"Test",(allocator<char> *)&local_68);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            ((basic_pstring<wchar_t> *)&ps,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  std::__cxx11::string::~string((string *)&ps2);
  if (ps.data_ == (char *)0x0) {
    ps2.data_ = (char *)0x0;
  }
  else {
    ps2.data_ = (char *)(long)*(int *)ps.data_;
  }
  local_68.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4f,"int main()",&ps2,(allocator<char> *)&local_68);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2,"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            (&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  bVar2 = xll::operator==((basic_pstring<wchar_t> *)&ps,&local_68);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x50,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy(&local_68);
  std::__cxx11::string::~string((string *)&ps2);
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2,
               L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring
            (&local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  bVar2 = xll::operator==((basic_pstring<wchar_t> *)&ps,&local_68);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x51,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy(&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    sVar6 = 0;
    pwVar5 = (wchar_t *)0x0;
  }
  else {
    sVar6 = (size_t)*(int *)ps.data_;
    pwVar5 = (wchar_t *)(ps.data_ + 4);
    if (sVar6 == 0) {
      pwVar5 = (wchar_t *)0x0;
    }
  }
  __x_01._M_str = pwVar5;
  __x_01._M_len = sVar6;
  __y_01._M_str = L"Test";
  __y_01._M_len = 4;
  bVar2 = std::operator==(__x_01,__y_01);
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x52,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy((basic_pstring<wchar_t> *)&ps);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&ps2,L"Test",(allocator<wchar_t> *)&local_68);
  xll::basic_pstring<wchar_t>::basic_pstring
            ((basic_pstring<wchar_t> *)&ps,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    ps2.data_ = (char *)0x0;
  }
  else {
    ps2.data_ = (char *)(long)*(int *)ps.data_;
  }
  local_68.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x57,"int main()",&ps2,(allocator<wchar_t> *)&local_68);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2,"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            (&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  bVar2 = xll::operator==((basic_pstring<wchar_t> *)&ps,&local_68);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x58,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy(&local_68);
  std::__cxx11::string::~string((string *)&ps2);
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2,
               L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring
            (&local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps2);
  bVar2 = xll::operator==((basic_pstring<wchar_t> *)&ps,&local_68);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x59,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy(&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&ps2);
  if (ps.data_ == (char *)0x0) {
    sVar6 = 0;
    pwVar5 = (wchar_t *)0x0;
  }
  else {
    sVar6 = (size_t)*(int *)ps.data_;
    pwVar5 = (wchar_t *)(ps.data_ + 4);
    if (sVar6 == 0) {
      pwVar5 = (wchar_t *)0x0;
    }
  }
  __x_02._M_str = pwVar5;
  __x_02._M_len = sVar6;
  __y_02._M_str = L"Test";
  __y_02._M_len = 4;
  bVar2 = std::operator==(__x_02,__y_02);
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x5a,"int main()",bVar2);
  xll::basic_pstring<wchar_t>::destroy((basic_pstring<wchar_t> *)&ps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ps2,"Copy",(allocator<char> *)&local_68);
  xll::basic_pstring<char>::basic_pstring
            (&ps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  std::__cxx11::string::~string((string *)&ps2);
  xll::basic_pstring<char>::basic_pstring(&ps2,&ps);
  if (ps.data_ == (char *)0x0) {
    local_68.data_ = (wchar_t *)0x0;
  }
  else {
    local_68.data_ = (wchar_t *)(long)*ps.data_;
  }
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x60,"int main()",&local_68,&local_34);
  if (ps2.data_ == (char *)0x0) {
    local_68.data_ = (wchar_t *)0x0;
  }
  else {
    local_68.data_ = (wchar_t *)(long)*ps2.data_;
  }
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x61,"int main()",&local_68,&local_34);
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_68,"Copy");
  bVar2 = xll::operator==(&ps,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps1 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x62,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_68,"Copy");
  bVar2 = xll::operator==(&ps2,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps2 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,99,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  xll::basic_pstring<char>::destroy(&ps2);
  xll::basic_pstring<char>::destroy(&ps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ps2,"Move",(allocator<char> *)&local_68);
  xll::basic_pstring<char>::basic_pstring
            (&ps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps2);
  std::__cxx11::string::~string((string *)&ps2);
  if (ps.data_ == (char *)0x0) {
    ps2.data_ = (char *)0x0;
  }
  else {
    ps2.data_ = (char *)(long)*ps.data_;
  }
  local_68.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x68,"int main()",&ps2,(allocator<char> *)&local_68);
  pVar1 = ps;
  ps.data_ = (char *)0x0;
  local_68.data_ = (wchar_t *)0x0;
  ps2 = pVar1;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6a,"int main()",&local_68,&local_34);
  if (pVar1.data_ == (char *)0x0) {
    local_68.data_ = (wchar_t *)0x0;
  }
  else {
    local_68.data_ = (wchar_t *)(long)*pVar1.data_;
  }
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6b,"int main()",&local_68,&local_34);
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_68,"Move");
  bVar2 = xll::operator==(&ps2,(basic_pstring<char> *)&local_68);
  boost::detail::test_impl
            ("ps2 == \"Move\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6c,"int main()",bVar2);
  xll::basic_pstring<char>::destroy((basic_pstring<char> *)&local_68);
  xll::basic_pstring<char>::destroy(&ps2);
  xll::basic_pstring<char>::destroy(&ps);
  iVar3 = boost::report_errors();
  return iVar3;
}

Assistant:

int main()
{
    using namespace std::string_literals;
    using namespace std::string_view_literals;

    {
        // compile-time wide pstring view
        constexpr auto wide = make_wpstring_view(L"Literal");
        BOOST_TEST(std::wstring_view(wide) == L"Literal");
        BOOST_TEST_EQ(wide.size(), 7);
    }
    {
        // compile-time narrow pstring view
        constexpr auto narrow = make_pstring_view("Literal");
        BOOST_TEST(std::string_view(narrow) == "Literal");
        BOOST_TEST_EQ(narrow.size(), 7);
    }
    {
        // compile-time wide pstring array
        constexpr std::array<wchar_t, 4> arr {{ L'T', L'E', L'S', L'T' }};
        constexpr auto wide = make_wpstring_array(arr);
        BOOST_TEST(std::wstring_view(wide) == L"TEST");
        BOOST_TEST_EQ(wide.size(), 4);
    }
    {
        // compile-time narrow pstring array
        constexpr std::array<char, 4> arr {{ 'T', 'E', 'S', 'T' }};
        constexpr auto narrow = make_pstring_array(arr);
        BOOST_TEST(std::string_view(narrow) == "TEST");
        BOOST_TEST_EQ(narrow.size(), 4);
    }
    {
        // narrow pstring literals
        using namespace xll::pstring_literals;
        auto ps = "Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(ps), pstring>));
        BOOST_TEST(ps == "Test"s);
    }
    {
        // wide pstring literals
        using namespace xll::pstring_literals;
        auto wps = L"Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(wps), wpstring>));
        BOOST_TEST(wps == L"Test"s);
    }
    {
        // narrow pstring with no conversion
        pstring ps(std::string("Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // narrow pstring with UTF-16 to UTF-8 conversion
        pstring ps(std::wstring(L"Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // wide pstring with UTF-8 to UTF-16 conversion
        wpstring wps(std::string("Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // wide pstring with no conversion
        wpstring wps(std::wstring(L"Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // copy construct
        pstring ps1(std::string("Copy"));
        pstring ps2(ps1);
        BOOST_TEST_EQ(ps1.size(), 4);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps1 == "Copy");
        BOOST_TEST(ps2 == "Copy");
    }
    {
        // move construct
        pstring ps1(std::string("Move"));
        BOOST_TEST_EQ(ps1.size(), 4);
        pstring ps2(std::move(ps1));
        BOOST_TEST_EQ(ps1.size(), 0);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps2 == "Move");
    }

    return boost::report_errors();
}